

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_destination *
oonf_layer2_destination_add
          (oonf_layer2_neigh *l2neigh,netaddr *destination,oonf_layer2_origin *origin)

{
  uint8_t uVar1;
  avl_node *paVar2;
  oonf_layer2_neigh *local_58;
  oonf_layer2_destination *l2dst;
  oonf_layer2_origin *origin_local;
  netaddr *destination_local;
  oonf_layer2_neigh *l2neigh_local;
  
  paVar2 = avl_find(&l2neigh->destinations,destination);
  if (paVar2 == (avl_node *)0x0) {
    local_58 = (oonf_layer2_neigh *)0x0;
  }
  else {
    local_58 = (oonf_layer2_neigh *)&paVar2[-1].parent;
  }
  if (local_58 == (oonf_layer2_neigh *)0x0) {
    l2neigh_local = (oonf_layer2_neigh *)oonf_class_malloc(&_l2dst_class);
    if (l2neigh_local == (oonf_layer2_neigh *)0x0) {
      l2neigh_local = (oonf_layer2_neigh *)0x0;
    }
    else {
      *(undefined8 *)(l2neigh_local->key).addr._addr = *(undefined8 *)destination->_addr;
      *(undefined8 *)((l2neigh_local->key).addr._addr + 8) = *(undefined8 *)(destination->_addr + 8)
      ;
      uVar1 = destination->_prefix_len;
      (l2neigh_local->key).addr._type = destination->_type;
      (l2neigh_local->key).addr._prefix_len = uVar1;
      *(oonf_layer2_origin **)((l2neigh_local->key).link_id + 0xd) = origin;
      *(oonf_layer2_neigh **)((l2neigh_local->key).link_id + 5) = l2neigh;
      *(oonf_layer2_neigh **)((l2neigh_local->_next_hop_v6)._addr + 10) = l2neigh_local;
      avl_insert(&l2neigh->destinations,(avl_node *)&l2neigh_local->network);
      oonf_class_event(&_l2dst_class,l2neigh_local,OONF_OBJECT_ADDED);
    }
  }
  else {
    l2neigh_local = local_58;
  }
  return (oonf_layer2_destination *)l2neigh_local;
}

Assistant:

struct oonf_layer2_destination *
oonf_layer2_destination_add(
  struct oonf_layer2_neigh *l2neigh, const struct netaddr *destination, const struct oonf_layer2_origin *origin) {
  struct oonf_layer2_destination *l2dst;

  l2dst = oonf_layer2_destination_get(l2neigh, destination);
  if (l2dst) {
    return l2dst;
  }

  l2dst = oonf_class_malloc(&_l2dst_class);
  if (!l2dst) {
    return NULL;
  }

  /* copy data into destination storage */
  memcpy(&l2dst->destination, destination, sizeof(*destination));
  l2dst->origin = origin;

  /* add back-pointer */
  l2dst->neighbor = l2neigh;

  /* add to neighbor tree */
  l2dst->_node.key = &l2dst->destination;
  avl_insert(&l2neigh->destinations, &l2dst->_node);

  oonf_class_event(&_l2dst_class, l2dst, OONF_OBJECT_ADDED);
  return l2dst;
}